

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O3

void ImVector_ImDrawCmd_resizeT(ImVector_ImDrawCmd *self,int new_size,ImDrawCmd v)

{
  undefined8 *puVar1;
  ImDrawCmd *pIVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  
  iVar5 = self->Capacity;
  if (iVar5 < new_size) {
    if (iVar5 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar5 / 2 + iVar5;
    }
    if (iVar5 <= new_size) {
      iVar5 = new_size;
    }
    pIVar2 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar5 * 0x38);
    if (self->Data != (ImDrawCmd *)0x0) {
      memcpy(pIVar2,self->Data,(long)self->Size * 0x38);
      ImGui::MemFree(self->Data);
    }
    self->Data = pIVar2;
    self->Capacity = iVar5;
  }
  iVar5 = self->Size;
  if (iVar5 < new_size) {
    lVar3 = (long)new_size - (long)iVar5;
    lVar4 = (long)iVar5 * 0x38;
    do {
      pIVar2 = self->Data;
      *(void **)((long)&pIVar2->UserCallbackData + lVar4) = v.UserCallbackData;
      puVar1 = (undefined8 *)((long)&pIVar2->VtxOffset + lVar4);
      *puVar1 = v._32_8_;
      puVar1[1] = v.UserCallback;
      puVar1 = (undefined8 *)((long)&(pIVar2->ClipRect).w + lVar4);
      *puVar1 = v._16_8_;
      puVar1[1] = v.TextureId;
      puVar1 = (undefined8 *)((long)&pIVar2->ElemCount + lVar4);
      *puVar1 = v._0_8_;
      puVar1[1] = v.ClipRect._4_8_;
      lVar4 = lVar4 + 0x38;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  self->Size = new_size;
  return;
}

Assistant:

CIMGUI_API void ImVector_ImDrawCmd_resizeT(ImVector_ImDrawCmd* self,int new_size,const ImDrawCmd v)
{
    return self->resize(new_size,v);
}